

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O2

int __thiscall
QGraphicsLinearLayout::stretchFactor(QGraphicsLinearLayout *this,QGraphicsLayoutItem *item)

{
  QGraphicsLayoutItemPrivate *pQVar1;
  int iVar2;
  long in_FS_OFFSET;
  char local_28 [24];
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (item == (QGraphicsLayoutItem *)0x0) {
    local_28[0] = '\x02';
    local_28[1] = '\0';
    local_28[2] = '\0';
    local_28[3] = '\0';
    local_28[0x14] = '\0';
    local_28[0x15] = '\0';
    local_28[0x16] = '\0';
    local_28[0x17] = '\0';
    local_28[4] = '\0';
    local_28[5] = '\0';
    local_28[6] = '\0';
    local_28[7] = '\0';
    local_28[8] = '\0';
    local_28[9] = '\0';
    local_28[10] = '\0';
    local_28[0xb] = '\0';
    local_28[0xc] = '\0';
    local_28[0xd] = '\0';
    local_28[0xe] = '\0';
    local_28[0xf] = '\0';
    local_28[0x10] = '\0';
    local_28[0x11] = '\0';
    local_28[0x12] = '\0';
    local_28[0x13] = '\0';
    local_10 = "default";
    QMessageLogger::warning
              (local_28,
               "QGraphicsLinearLayout::setStretchFactor: cannot return a stretch factor for a null item"
              );
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return 0;
    }
  }
  else {
    pQVar1 = (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      iVar2 = QGraphicsGridLayoutEngine::stretchFactor
                        ((QGraphicsGridLayoutEngine *)(pQVar1[1].cachedSizeHints + 1),item,
                         *(Orientation *)((long)&pQVar1[1].cachedSizeHints[0].wd + 4));
      return iVar2;
    }
  }
  __stack_chk_fail();
}

Assistant:

int QGraphicsLinearLayout::stretchFactor(QGraphicsLayoutItem *item) const
{
    Q_D(const QGraphicsLinearLayout);
    if (!item) {
        qWarning("QGraphicsLinearLayout::setStretchFactor: cannot return"
                 " a stretch factor for a null item");
        return 0;
    }
    return d->engine.stretchFactor(item, d->orientation);
}